

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O2

double aom_ssim2(uint8_t *img1,uint8_t *img2,int stride_img1,int stride_img2,int width,int height)

{
  undefined4 in_register_00000014;
  int iVar1;
  long lVar2;
  double dVar3;
  uint32_t in_stack_ffffffffffffff88;
  uint32_t local_74;
  uint32_t sum_sq_r;
  uint32_t sum_sq_s;
  uint32_t sum_r;
  uint32_t sum_s;
  double local_60;
  int local_54;
  long local_50;
  long local_48;
  ulong local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,stride_img1);
  local_54 = height + -8;
  local_48 = (long)(stride_img1 * 4);
  local_50 = (long)(stride_img2 * 4);
  local_60 = 0.0;
  iVar1 = 0;
  for (local_40 = 0; (int)local_40 <= local_54; local_40 = (ulong)((int)local_40 + 4)) {
    for (lVar2 = 0; lVar2 <= width + -8; lVar2 = lVar2 + 4) {
      sum_s = 0;
      sum_r = 0;
      sum_sq_s = 0;
      sum_sq_r = 0;
      local_74 = 0;
      aom_ssim_parms_8x8_sse2
                (img1 + lVar2,local_38,img2 + lVar2,stride_img2,&sum_s,&sum_r,&sum_sq_s,&sum_sq_r,
                 &local_74);
      dVar3 = similarity(sum_s,sum_r,sum_sq_s,sum_sq_r,local_74,8,in_stack_ffffffffffffff88);
      local_60 = local_60 + dVar3;
      iVar1 = iVar1 + 1;
    }
    img1 = img1 + local_48;
    img2 = img2 + local_50;
  }
  return local_60 / (double)iVar1;
}

Assistant:

double aom_ssim2(const uint8_t *img1, const uint8_t *img2, int stride_img1,
                 int stride_img2, int width, int height) {
  int i, j;
  int samples = 0;
  double ssim_total = 0;

  // sample point start with each 4x4 location
  for (i = 0; i <= height - 8;
       i += 4, img1 += stride_img1 * 4, img2 += stride_img2 * 4) {
    for (j = 0; j <= width - 8; j += 4) {
      double v = ssim_8x8(img1 + j, stride_img1, img2 + j, stride_img2);
      ssim_total += v;
      samples++;
    }
  }
  ssim_total /= samples;
  return ssim_total;
}